

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  char local_41;
  string local_40;
  
  if ((this->Directory)._M_string_length == 0) {
    GetFullName_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    local_41 = '/';
    GetFullName_abi_cxx11_(&local_40,this);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              (__return_storage_ptr__,&this->Directory,&local_41,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }